

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
libcellml::Parser::ParserImpl::loadModel(ParserImpl *this,ModelPtr *model,string *input)

{
  size_type sVar1;
  pointer pcVar2;
  element_type *peVar3;
  IssueImpl *this_00;
  element_type *peVar4;
  ParserImpl *pPVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  size_t sVar10;
  long *plVar11;
  size_type *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong *puVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  XmlNodePtr *node_00;
  XmlNodePtr *extraout_RDX;
  XmlNodePtr *pXVar17;
  XmlNodePtr *node_01;
  shared_ptr<libcellml::XmlNode> *connectionNode;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  IssueImpl *pIVar19;
  undefined8 uVar20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
  *this_01;
  _Alloc_hider _Var22;
  ulong uVar23;
  _Rb_tree_node_base *p_Var24;
  undefined1 auVar25 [16];
  IssuePtr IVar26;
  DescriptionList issueList;
  NamePairList usedConnections;
  string attributeName;
  string uri_1;
  IssuePtr issue_4;
  IssuePtr issue_9;
  IssuePtr issue_3;
  XmlNodePtr node;
  vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
  connectionNodes;
  XmlNodePtr childNode;
  XmlAttributePtr attribute;
  vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
  encapsulationNodes;
  XmlDocPtr doc;
  XmlNamespaceMap elementNamespaceMap;
  IssuePtr issue_8;
  NodeAttributeNamespaceInfo attributeNamespaceMap;
  string local_218;
  string local_1f8;
  ParserImpl *local_1d8;
  string local_1d0;
  string local_1b0;
  ModelPtr *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  IssuePtr local_148;
  XmlDoc local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  undefined1 local_128 [24];
  long lStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  XmlAttributePtr local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [24];
  long lStack_b0;
  IssueImpl *local_a0;
  XmlDoc *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  undefined1 local_88 [48];
  IssuePtr local_58;
  NodeAttributeNamespaceInfo local_48;
  
  local_98 = (XmlDoc *)0x0;
  local_1d8 = this;
  local_190 = model;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<libcellml::XmlDoc,std::allocator<libcellml::XmlDoc>>
            (&local_90,&local_98,(allocator<libcellml::XmlDoc> *)local_88);
  XmlDoc::parse(local_98,input);
  sVar10 = XmlDoc::xmlErrorCount(local_98);
  if (sVar10 != 0) {
    for (uVar23 = 0; sVar10 = XmlDoc::xmlErrorCount(local_98), uVar23 < sVar10; uVar23 = uVar23 + 1)
    {
      Issue::IssueImpl::create();
      pIVar19 = *(IssueImpl **)(local_218._M_dataplus._M_p + 8);
      XmlDoc::xmlError_abi_cxx11_(&local_1f8,local_98,uVar23);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,0x2a61ff);
      psVar12 = (size_type *)(plVar11 + 2);
      if ((size_type *)*plVar11 == psVar12) {
        local_88._16_8_ = *psVar12;
        local_88._24_8_ = plVar11[3];
        local_88._0_8_ = local_88 + 0x10;
      }
      else {
        local_88._16_8_ = *psVar12;
        local_88._0_8_ = (size_type *)*plVar11;
      }
      local_88._8_8_ = plVar11[1];
      *plVar11 = (long)psVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar19,(string *)local_88);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      Issue::IssueImpl::setReferenceRule(*(IssueImpl **)(local_218._M_dataplus._M_p + 8),XML);
      Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,(IssuePtr *)&local_218);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length);
      }
    }
  }
  XmlDoc::rootNode(&local_138);
  if (local_138.mPimpl == (XmlDocImpl *)0x0) {
    Issue::IssueImpl::create();
    pIVar19 = *(IssueImpl **)(local_1f8._M_dataplus._M_p + 8);
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Could not get a valid XML root node from the provided input.","")
    ;
    Issue::IssueImpl::setDescription(pIVar19,(string *)local_88);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    bVar6 = Strict::isStrict(&local_1d8->mParser->super_Strict);
    if (bVar6) {
      Issue::IssueImpl::setReferenceRule(*(IssueImpl **)(local_1f8._M_dataplus._M_p + 8),XML);
    }
    Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,(IssuePtr *)&local_1f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length);
    }
    goto LAB_0022d1e5;
  }
  bVar6 = XmlNode::isCellml20Element((XmlNode *)local_138.mPimpl,"model");
  pPVar5 = local_1d8;
  local_1d8->mParsing20Version = bVar6;
  traverseTreeForElementNamespaces_abi_cxx11_
            ((XmlNamespaceMap *)local_88,(libcellml *)&local_138,node_00);
  pXVar17 = extraout_RDX;
  if ((pPVar5->mParsing20Version == true) &&
     ((_Rb_tree_node_base *)local_88._24_8_ != (_Rb_tree_node_base *)(local_88 + 8))) {
    p_Var24 = (_Rb_tree_node_base *)local_88._24_8_;
    do {
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,*(long *)(p_Var24 + 1),
                 (long)&(p_Var24[1]._M_parent)->_M_color + *(long *)(p_Var24 + 1));
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,*(long *)(p_Var24 + 2),
                 (long)&(p_Var24[2]._M_parent)->_M_color + *(long *)(p_Var24 + 2));
      iVar9 = std::__cxx11::string::compare((char *)&local_218);
      if ((iVar9 != 0) && (iVar9 = std::__cxx11::string::compare((char *)&local_218), iVar9 != 0)) {
        Issue::IssueImpl::create();
        pIVar19 = (IssueImpl *)
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128._0_8_ + 8))->_M_pi;
        std::operator+(&local_188,"Element \'",&local_1f8);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_188);
        psVar12 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_168.field_2._M_allocated_capacity = *psVar12;
          local_168.field_2._8_8_ = plVar11[3];
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar12;
          local_168._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_168._M_string_length = plVar11[1];
        *plVar11 = (long)psVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_168,(ulong)local_218._M_dataplus._M_p);
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
          local_1b0.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
          local_1b0.field_2._8_8_ = plVar11[3];
        }
        else {
          local_1b0.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
          local_1b0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_1b0._M_string_length = plVar11[1];
        *plVar11 = (long)p_Var18;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_1b0);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar13) {
          local_1d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_1d0.field_2._8_8_ = plVar11[3];
        }
        else {
          local_1d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_1d0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_1d0._M_string_length = plVar11[1];
        *plVar11 = (long)paVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        Issue::IssueImpl::setDescription(pIVar19,&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        Issue::IssueImpl::setReferenceRule
                  ((IssueImpl *)
                   ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128._0_8_ + 8))->_M_pi,
                   XML_UNEXPECTED_NAMESPACE);
        Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,(IssuePtr *)local_128);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      auVar25 = std::_Rb_tree_increment(p_Var24);
      pXVar17 = auVar25._8_8_;
      p_Var24 = auVar25._0_8_;
    } while (p_Var24 != (_Rb_tree_node_base *)(local_88 + 8));
  }
  traverseTreeForAttributeNamespaces_abi_cxx11_(&local_48,(libcellml *)&local_138,pXVar17);
  if ((local_1d8->mParsing20Version == true) &&
     (local_a0 = (IssueImpl *)
                 local_48.
                 super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
     local_48.
     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     local_48.
     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    pIVar19 = (IssueImpl *)
              local_48.
              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      sVar1 = pIVar19[2].mDescription.field_2._M_allocated_capacity;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,sVar1,
                 *(long *)((long)&pIVar19[2].mDescription.field_2 + 8) + sVar1);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      pcVar2 = (pIVar19->mDescription)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,pcVar2,pcVar2 + (pIVar19->mDescription)._M_string_length);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      peVar3 = pIVar19[1].mItem.
               super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,peVar3,
                 (long)&(pIVar19[1].mItem.
                         super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_vptr__Sp_counted_base + (long)peVar3);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,*(long *)&pIVar19->mLevel,
                 (long)&((pIVar19->mItem).
                         super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->mPimpl + *(long *)&pIVar19->mLevel);
      iVar9 = std::__cxx11::string::compare((char *)&local_1f8);
      if (((((iVar9 != 0) || (iVar9 = std::__cxx11::string::compare((char *)&local_218), iVar9 != 0)
            ) || (iVar9 = std::__cxx11::string::compare((char *)&local_1d0), iVar9 != 0)) ||
          (iVar9 = std::__cxx11::string::compare((char *)&local_1b0), iVar9 != 0)) &&
         (((iVar9 = std::__cxx11::string::compare((char *)&local_1f8), iVar9 != 0 ||
           (iVar9 = std::__cxx11::string::compare((char *)&local_218), iVar9 != 0)) ||
          ((iVar9 = std::__cxx11::string::compare((char *)&local_1d0), iVar9 != 0 ||
           (iVar9 = std::__cxx11::string::compare((char *)&local_1b0), iVar9 != 0)))))) {
        Issue::IssueImpl::create();
        this_00 = *(IssueImpl **)
                   ((long)local_148.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 8);
        std::operator+(&local_108,"Element \'",&local_1f8);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_108);
        local_e8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_d8;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar13) {
          local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_d8._8_8_ = plVar11[3];
        }
        else {
          local_d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_e8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar11;
        }
        local_e8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[1];
        *plVar11 = (long)paVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_e8,(ulong)local_1d0._M_dataplus._M_p);
        local_c8._0_8_ = local_c8 + 0x10;
        pXVar17 = (XmlNodePtr *)(plVar11 + 2);
        if ((XmlNodePtr *)*plVar11 == pXVar17) {
          local_c8._16_8_ =
               (pXVar17->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          lStack_b0 = plVar11[3];
        }
        else {
          local_c8._16_8_ =
               (pXVar17->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_c8._0_8_ = (XmlNodePtr *)*plVar11;
        }
        local_c8._8_8_ = plVar11[1];
        *plVar11 = (long)pXVar17;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append(local_c8);
        local_128._0_8_ = local_128 + 0x10;
        p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
          local_128._16_8_ =
               ((__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)
               &p_Var18->_vptr__Sp_counted_base)->_M_ptr;
          lStack_110 = plVar11[3];
        }
        else {
          local_128._16_8_ =
               ((__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)
               &p_Var18->_vptr__Sp_counted_base)->_M_ptr;
          local_128._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11;
        }
        local_128._8_8_ = plVar11[1];
        *plVar11 = (long)p_Var18;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    (local_128,(ulong)local_1b0._M_dataplus._M_p);
        puVar14 = (ulong *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_188.field_2._M_allocated_capacity = *puVar14;
          local_188.field_2._8_8_ = plVar11[3];
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        }
        else {
          local_188.field_2._M_allocated_capacity = *puVar14;
          local_188._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_188._M_string_length = plVar11[1];
        *plVar11 = (long)puVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_188);
        psVar12 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_168.field_2._M_allocated_capacity = *psVar12;
          local_168.field_2._8_8_ = plVar11[3];
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar12;
          local_168._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_168._M_string_length = plVar11[1];
        *plVar11 = (long)psVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        Issue::IssueImpl::setDescription(this_00,&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 0x10)) {
          operator_delete((void *)local_128._0_8_,
                          (ulong)((long)&((__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                           *)local_128._16_8_)->_M_ptr + 1));
        }
        if ((XmlNodePtr *)local_c8._0_8_ != (XmlNodePtr *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,
                          (ulong)((long)&((__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                                           *)local_c8._16_8_)->_M_ptr + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr != &local_d8) {
          operator_delete(local_e8.
                          super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,local_d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        Issue::IssueImpl::setReferenceRule
                  (*(IssueImpl **)
                    ((long)local_148.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                    8),XML_ATTRIBUTE_HAS_NAMESPACE);
        Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,&local_148);
        if (local_148.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_148.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      pIVar19 = (IssueImpl *)
                &pIVar19[2].mItem.
                 super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    } while (pIVar19 != local_a0);
  }
  bVar6 = Strict::isStrict(&local_1d8->mParser->super_Strict);
  if (((bVar6) && (local_1d8->mParsing20Version != true)) ||
     (bVar6 = XmlNode::isCellmlElement((XmlNode *)local_138.mPimpl,"model"), !bVar6)) {
    Issue::IssueImpl::create();
    XmlNode::name_abi_cxx11_(&local_1f8,(XmlNode *)local_138.mPimpl);
    iVar9 = std::__cxx11::string::compare((char *)&local_1f8);
    paVar13 = &local_1f8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar13) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (iVar9 == 0) {
      XmlNode::namespaceUri_abi_cxx11_(&local_1f8,(XmlNode *)local_138.mPimpl);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::__cxx11::string::_M_replace((ulong)&local_1f8,0,(char *)0x0,0x2a6331);
      }
      bVar6 = Strict::isStrict(&local_1d8->mParser->super_Strict);
      if ((bVar6) &&
         (bVar6 = XmlNode::isCellml1XElement((XmlNode *)local_138.mPimpl,"model"), bVar6)) {
        pIVar19 = *(IssueImpl **)(local_188._M_dataplus._M_p + 8);
        nodesCellMl1XVersion_abi_cxx11_(&local_1b0,(libcellml *)&local_138,node_01);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x2a6336);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar15) {
          local_1d0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_1d0.field_2._8_8_ = plVar11[3];
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        }
        else {
          local_1d0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_1d0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_1d0._M_string_length = plVar11[1];
        *plVar11 = (long)paVar15;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_1d0);
        p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
          local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
          local_218.field_2._8_8_ = plVar11[3];
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        }
        else {
          local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
          local_218._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_218._M_string_length = plVar11[1];
        *plVar11 = (long)p_Var18;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        Issue::IssueImpl::setDescription(pIVar19,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        uVar20 = local_1b0.field_2._M_allocated_capacity;
        _Var22._M_p = local_1b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
LAB_0022d137:
          operator_delete(_Var22._M_p,uVar20 + 1);
        }
      }
      else {
        std::operator+(&local_1d0,"Model element is in an invalid namespace \'",&local_1f8);
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_1d0);
        p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
          local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
          local_218.field_2._8_8_ = plVar11[3];
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        }
        else {
          local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
          local_218._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_218._M_string_length = plVar11[1];
        *plVar11 = (long)p_Var18;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        paVar15 = &local_1d0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != paVar15) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        bVar6 = Strict::isStrict(&local_1d8->mParser->super_Strict);
        if (bVar6) {
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_168,"http://www.cellml.org/cellml/2.0#","");
          plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x2a63a0);
          p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
            local_1b0.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
            local_1b0.field_2._8_8_ = plVar11[3];
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          }
          else {
            local_1b0.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
            local_1b0._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1b0._M_string_length = plVar11[1];
          *plVar11 = (long)p_Var18;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_1b0);
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar16) {
            local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_1d0.field_2._8_8_ = plVar11[3];
            local_1d0._M_dataplus._M_p = (pointer)paVar15;
          }
          else {
            local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_1d0._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1d0._M_string_length = plVar11[1];
          *plVar11 = (long)paVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar15) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
        }
        Issue::IssueImpl::setDescription(*(IssueImpl **)(local_188._M_dataplus._M_p + 8),&local_218)
        ;
        uVar20 = local_218.field_2._M_allocated_capacity;
        _Var22._M_p = local_218._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) goto LAB_0022d137;
      }
      uVar20 = local_1f8.field_2._M_allocated_capacity;
      _Var22._M_p = local_1f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar13) goto LAB_0022d14e;
    }
    else {
      pIVar19 = *(IssueImpl **)(local_188._M_dataplus._M_p + 8);
      XmlNode::name_abi_cxx11_(&local_1d0,(XmlNode *)local_138.mPimpl);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x2a63d7);
      p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
        local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
        local_218.field_2._8_8_ = plVar11[3];
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      }
      else {
        local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
        local_218._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_218._M_string_length = plVar11[1];
      *plVar11 = (long)p_Var18;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar15) {
        local_1f8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_1f8.field_2._8_8_ = plVar11[3];
        local_1f8._M_dataplus._M_p = (pointer)paVar13;
      }
      else {
        local_1f8.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_1f8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_1f8._M_string_length = plVar11[1];
      *plVar11 = (long)paVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar19,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar13) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      uVar20 = local_1d0.field_2._M_allocated_capacity;
      _Var22._M_p = local_1d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
LAB_0022d14e:
        operator_delete(_Var22._M_p,uVar20 + 1);
      }
    }
    AnyCellmlElement::AnyCellmlElementImpl::setModel
              ((AnyCellmlElementImpl *)
               **(undefined8 **)(*(long *)(local_188._M_dataplus._M_p + 8) + 0x28),local_190,MODEL);
    bVar6 = Strict::isStrict(&local_1d8->mParser->super_Strict);
    if (bVar6) {
      Issue::IssueImpl::setReferenceRule
                (*(IssueImpl **)(local_188._M_dataplus._M_p + 8),XML_UNEXPECTED_ELEMENT);
    }
    Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,(IssuePtr *)&local_188);
    _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length;
  }
  else {
    bVar6 = XmlNode::isCellml1XElement((XmlNode *)local_138.mPimpl,"model");
    local_1d8->mParsing1XVersion = bVar6;
    if (bVar6) {
      IVar26 = Issue::IssueImpl::create();
      pIVar19 = *(IssueImpl **)(local_1b0._M_dataplus._M_p + 8);
      nodesCellMl1XVersion_abi_cxx11_
                (&local_1d0,(libcellml *)&local_138,
                 (XmlNodePtr *)
                 IVar26.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi._M_pi);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x2a6336);
      p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
        local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
        local_218.field_2._8_8_ = plVar11[3];
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      }
      else {
        local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
        local_218._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_218._M_string_length = plVar11[1];
      *plVar11 = (long)p_Var18;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar13) {
        local_1f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_1f8.field_2._8_8_ = plVar11[3];
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      }
      else {
        local_1f8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_1f8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_1f8._M_string_length = plVar11[1];
      *plVar11 = (long)paVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar19,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      Issue::IssueImpl::setLevel(*(IssueImpl **)(local_1b0._M_dataplus._M_p + 8),MESSAGE);
      AnyCellmlElement::AnyCellmlElementImpl::setModel
                ((AnyCellmlElementImpl *)
                 **(undefined8 **)(*(long *)(local_1b0._M_dataplus._M_p + 8) + 0x28),local_190,MODEL
                );
      Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,(IssuePtr *)&local_1b0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_string_length);
      }
    }
    XmlNode::firstAttribute((XmlNode *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) {
      bVar6 = false;
    }
    else {
      paVar13 = &local_1b0.field_2;
      paVar15 = &local_1f8.field_2;
      bVar6 = false;
      do {
        bVar7 = XmlAttribute::isType
                          (local_e8.
                           super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,"name","");
        if (bVar7) {
          peVar4 = (local_190->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          XmlAttribute::value_abi_cxx11_
                    (&local_1f8,
                     local_e8.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          NamedEntity::setName((NamedEntity *)peVar4,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != paVar15) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          bVar6 = true;
        }
        else {
          bVar7 = isIdAttribute(&local_e8,local_1d8->mParsing1XVersion);
          if (bVar7) {
            peVar4 = (local_190->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            XmlAttribute::value_abi_cxx11_
                      (&local_1f8,
                       local_e8.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            Entity::setId((Entity *)peVar4,&local_1f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != paVar15) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            Issue::IssueImpl::create();
            pIVar19 = (IssueImpl *)
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128._0_8_ + 8))->_M_pi;
            if (local_1d8->mParsing1XVersion == true) {
              XmlNode::attribute_abi_cxx11_(&local_168,(XmlNode *)local_138.mPimpl,"name");
              plVar11 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_168,0,(char *)0x0,0x2a6479);
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
                local_1b0.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base
                ;
                local_1b0.field_2._8_8_ = plVar11[3];
                local_1b0._M_dataplus._M_p = (pointer)paVar13;
              }
              else {
                local_1b0.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base
                ;
                local_1b0._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_1b0._M_string_length = plVar11[1];
              *plVar11 = (long)p_Var18;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_1b0);
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
              paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 == paVar16) {
                local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_1d0.field_2._8_8_ = plVar11[3];
              }
              else {
                local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_1d0._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_1d0._M_string_length = plVar11[1];
              *plVar11 = (long)paVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              XmlAttribute::name_abi_cxx11_
                        (&local_188,
                         local_e8.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              uVar20 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                uVar20 = local_1d0.field_2._M_allocated_capacity;
              }
              uVar23 = (long)(_func_int ***)local_1d0._M_string_length +
                       (long)(_func_int ***)local_188._M_string_length;
              if ((ulong)uVar20 < uVar23) {
                uVar20 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  uVar20 = local_188.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar20 < uVar23) goto LAB_0022b605;
                plVar11 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_188,0,(char *)0x0,
                                             (ulong)local_1d0._M_dataplus._M_p);
              }
              else {
LAB_0022b605:
                plVar11 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_1d0,(ulong)local_188._M_dataplus._M_p);
              }
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
                local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base
                ;
                local_218.field_2._8_8_ = plVar11[3];
              }
              else {
                local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base
                ;
                local_218._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_218._M_string_length = plVar11[1];
              *plVar11 = (long)p_Var18;
              plVar11[1] = 0;
              *(undefined1 *)&p_Var18->_vptr__Sp_counted_base = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
              paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 == paVar16) {
                local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_1f8.field_2._8_8_ = plVar11[3];
                local_1f8._M_dataplus._M_p = (pointer)paVar15;
              }
              else {
                local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_1f8._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_1f8._M_string_length = plVar11[1];
              *plVar11 = (long)paVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              Issue::IssueImpl::setDescription(pIVar19,&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != paVar15) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != paVar13) {
                operator_delete(local_1b0._M_dataplus._M_p,
                                local_1b0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
              Issue::IssueImpl::setLevel
                        ((IssueImpl *)
                         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128._0_8_ + 8))->
                         _M_pi,MESSAGE);
            }
            else {
              XmlNode::attribute_abi_cxx11_(&local_168,(XmlNode *)local_138.mPimpl,"name");
              plVar11 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_168,0,(char *)0x0,0x2a6479);
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
                local_1b0.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base
                ;
                local_1b0.field_2._8_8_ = plVar11[3];
                local_1b0._M_dataplus._M_p = (pointer)paVar13;
              }
              else {
                local_1b0.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base
                ;
                local_1b0._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_1b0._M_string_length = plVar11[1];
              *plVar11 = (long)p_Var18;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_1b0);
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
              paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 == paVar16) {
                local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_1d0.field_2._8_8_ = plVar11[3];
              }
              else {
                local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_1d0._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_1d0._M_string_length = plVar11[1];
              *plVar11 = (long)paVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              XmlAttribute::name_abi_cxx11_
                        (&local_188,
                         local_e8.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              uVar20 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                uVar20 = local_1d0.field_2._M_allocated_capacity;
              }
              uVar23 = (long)(_func_int ***)local_1d0._M_string_length +
                       (long)(_func_int ***)local_188._M_string_length;
              if ((ulong)uVar20 < uVar23) {
                uVar20 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  uVar20 = local_188.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar20 < uVar23) goto LAB_0022b6a1;
                plVar11 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_188,0,(char *)0x0,
                                             (ulong)local_1d0._M_dataplus._M_p);
              }
              else {
LAB_0022b6a1:
                plVar11 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_1d0,(ulong)local_188._M_dataplus._M_p);
              }
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
                local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base
                ;
                local_218.field_2._8_8_ = plVar11[3];
              }
              else {
                local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base
                ;
                local_218._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_218._M_string_length = plVar11[1];
              *plVar11 = (long)p_Var18;
              plVar11[1] = 0;
              *(undefined1 *)&p_Var18->_vptr__Sp_counted_base = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
              paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 == paVar16) {
                local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_1f8.field_2._8_8_ = plVar11[3];
                local_1f8._M_dataplus._M_p = (pointer)paVar15;
              }
              else {
                local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_1f8._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_1f8._M_string_length = plVar11[1];
              *plVar11 = (long)paVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              Issue::IssueImpl::setDescription(pIVar19,&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != paVar15) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b0._M_dataplus._M_p != paVar13) {
                operator_delete(local_1b0._M_dataplus._M_p,
                                local_1b0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
              Issue::IssueImpl::setReferenceRule
                        ((IssueImpl *)
                         ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128._0_8_ + 8))->
                         _M_pi,MODEL_ELEMENT);
            }
            AnyCellmlElement::AnyCellmlElementImpl::setModel
                      ((AnyCellmlElementImpl *)
                       **(undefined8 **)
                         &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128._0_8_ + 8))->
                          _M_pi[2]._M_use_count,local_190,MODEL);
            Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,(IssuePtr *)local_128);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
            }
          }
        }
        XmlAttribute::next((XmlAttribute *)&local_1f8);
        _Var21._M_pi = local_e8.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
        local_e8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length;
        local_e8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_1f8._M_dataplus._M_p;
        local_1f8._M_dataplus._M_p = (pointer)0x0;
        local_1f8._M_string_length = 0;
        if ((_Var21._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var21._M_pi),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length);
        }
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0);
    }
    if (!bVar6 && (local_1d8->mParsing1XVersion & 1U) == 0) {
      Issue::IssueImpl::create();
      pIVar19 = *(IssueImpl **)(local_218._M_dataplus._M_p + 8);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"Model does not have a name attribute.","");
      Issue::IssueImpl::setDescription(pIVar19,&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      Issue::IssueImpl::setReferenceRule(*(IssueImpl **)(local_218._M_dataplus._M_p + 8),MODEL_NAME)
      ;
      AnyCellmlElement::AnyCellmlElementImpl::setModel
                ((AnyCellmlElementImpl *)
                 **(undefined8 **)(*(long *)(local_218._M_dataplus._M_p + 8) + 0x28),local_190,MODEL
                );
      Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,(IssuePtr *)&local_218);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length);
      }
    }
    XmlNode::firstChild((XmlNode *)&local_108);
    local_128._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128._16_8_ = (pointer)0x0;
    local_c8._16_8_ = (pointer)0x0;
    local_c8._0_8_ = (XmlNodePtr *)0x0;
    local_c8._8_8_ = (XmlNodePtr *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      paVar13 = &local_1d0.field_2;
      paVar15 = &local_1f8.field_2;
      do {
        if (local_1d8->mParsing20Version == true) {
          bVar6 = XmlNode::isCellml20Element((XmlNode *)local_108._M_dataplus._M_p,"component");
        }
        else {
          bVar6 = XmlNode::isCellml1XElement((XmlNode *)local_108._M_dataplus._M_p,"component");
        }
        if (bVar6 == false) {
          if (local_1d8->mParsing20Version == true) {
            bVar6 = XmlNode::isCellml20Element((XmlNode *)local_108._M_dataplus._M_p,"units");
          }
          else {
            bVar6 = XmlNode::isCellml1XElement((XmlNode *)local_108._M_dataplus._M_p,"units");
          }
          if (bVar6 != false) {
            Units::create();
            loadUnits(local_1d8,(UnitsPtr *)&local_1f8,(XmlNodePtr *)&local_108);
            Model::addUnits((local_190->
                            super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                            ,(UnitsPtr *)&local_1f8);
            _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_1f8._M_string_length;
            goto LAB_0022bcad;
          }
          if (local_1d8->mParsing20Version == true) {
            bVar6 = XmlNode::isCellml20Element((XmlNode *)local_108._M_dataplus._M_p,"import");
          }
          else {
            bVar6 = XmlNode::isCellml1XElement((XmlNode *)local_108._M_dataplus._M_p,"import");
          }
          if (bVar6 != false) {
            ImportSource::create();
            loadImport(local_1d8,(ImportSourcePtr *)&local_1f8,local_190,(XmlNodePtr *)&local_108);
            _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_1f8._M_string_length;
            goto LAB_0022bcad;
          }
          bVar6 = XmlNode::isCellml20Element((XmlNode *)local_108._M_dataplus._M_p,"encapsulation");
          if (bVar6) {
            XmlNode::firstAttribute((XmlNode *)&local_1f8);
            _Var22._M_p = local_1f8._M_dataplus._M_p;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length)
              ;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var22._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              XmlNode::firstAttribute((XmlNode *)&local_148);
              while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_148.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr !=
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0) {
                bVar6 = XmlAttribute::isType
                                  ((XmlAttribute *)
                                   local_148.
                                   super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr,"id","");
                if (bVar6) {
                  peVar4 = (local_190->
                           super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                  XmlAttribute::value_abi_cxx11_
                            (&local_1f8,
                             (XmlAttribute *)
                             local_148.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            );
                  ComponentEntity::setEncapsulationId(&peVar4->super_ComponentEntity,&local_1f8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != paVar15) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity + 1);
                  }
                }
                else {
                  Issue::IssueImpl::create();
                  pIVar19 = (local_58.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            )->mPimpl;
                  NamedEntity::name_abi_cxx11_
                            (&local_168,
                             (NamedEntity *)
                             (local_190->
                             super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
                  plVar11 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_168,0,(char *)0x0,0x2a64db);
                  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                  p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
                    local_1b0.field_2._M_allocated_capacity =
                         (size_type)p_Var18->_vptr__Sp_counted_base;
                    local_1b0.field_2._8_8_ = plVar11[3];
                  }
                  else {
                    local_1b0.field_2._M_allocated_capacity =
                         (size_type)p_Var18->_vptr__Sp_counted_base;
                    local_1b0._M_dataplus._M_p = (pointer)*plVar11;
                  }
                  local_1b0._M_string_length = plVar11[1];
                  *plVar11 = (long)p_Var18;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1b0);
                  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11 == paVar16) {
                    local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_1d0.field_2._8_8_ = plVar11[3];
                    local_1d0._M_dataplus._M_p = (pointer)paVar13;
                  }
                  else {
                    local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_1d0._M_dataplus._M_p = (pointer)*plVar11;
                  }
                  local_1d0._M_string_length = plVar11[1];
                  *plVar11 = (long)paVar16;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  XmlAttribute::name_abi_cxx11_
                            (&local_188,
                             (XmlAttribute *)
                             local_148.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            );
                  uVar20 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d0._M_dataplus._M_p != paVar13) {
                    uVar20 = local_1d0.field_2._M_allocated_capacity;
                  }
                  uVar23 = (long)(_func_int ***)local_1d0._M_string_length +
                           (long)(_func_int ***)local_188._M_string_length;
                  if ((ulong)uVar20 < uVar23) {
                    uVar20 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_188._M_dataplus._M_p != &local_188.field_2) {
                      uVar20 = local_188.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar20 < uVar23) goto LAB_0022bf3b;
                    plVar11 = (long *)std::__cxx11::string::replace
                                                ((ulong)&local_188,0,(char *)0x0,
                                                 (ulong)local_1d0._M_dataplus._M_p);
                  }
                  else {
LAB_0022bf3b:
                    plVar11 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_1d0,
                                                 (ulong)local_188._M_dataplus._M_p);
                  }
                  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                  p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
                    local_218.field_2._M_allocated_capacity =
                         (size_type)p_Var18->_vptr__Sp_counted_base;
                    local_218.field_2._8_8_ = plVar11[3];
                  }
                  else {
                    local_218.field_2._M_allocated_capacity =
                         (size_type)p_Var18->_vptr__Sp_counted_base;
                    local_218._M_dataplus._M_p = (pointer)*plVar11;
                  }
                  local_218._M_string_length = plVar11[1];
                  *plVar11 = (long)p_Var18;
                  plVar11[1] = 0;
                  *(undefined1 *)&p_Var18->_vptr__Sp_counted_base = 0;
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
                  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11 == paVar16) {
                    local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_1f8.field_2._8_8_ = plVar11[3];
                    local_1f8._M_dataplus._M_p = (pointer)paVar15;
                  }
                  else {
                    local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_1f8._M_dataplus._M_p = (pointer)*plVar11;
                  }
                  local_1f8._M_string_length = plVar11[1];
                  *plVar11 = (long)paVar16;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  Issue::IssueImpl::setDescription(pIVar19,&local_1f8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != paVar15) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p != &local_218.field_2) {
                    operator_delete(local_218._M_dataplus._M_p,
                                    local_218.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                    operator_delete(local_188._M_dataplus._M_p,
                                    local_188.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d0._M_dataplus._M_p != paVar13) {
                    operator_delete(local_1d0._M_dataplus._M_p,
                                    local_1d0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                    operator_delete(local_1b0._M_dataplus._M_p,
                                    local_1b0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                    operator_delete(local_168._M_dataplus._M_p,
                                    local_168.field_2._M_allocated_capacity + 1);
                  }
                  AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                            ((((local_58.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->mPimpl->mItem).
                              super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->mPimpl,local_190);
                  Issue::IssueImpl::setReferenceRule
                            ((local_58.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mPimpl,ENCAPSULATION_ELEMENT);
                  Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,&local_58);
                  if (local_58.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_58.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                }
                XmlAttribute::next((XmlAttribute *)&local_1f8);
                _Var21._M_pi = local_148.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
                local_148.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length;
                local_148.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)local_1f8._M_dataplus._M_p;
                local_1f8._M_dataplus._M_p = (pointer)0x0;
                local_1f8._M_string_length = 0;
                if ((_Var21._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var21._M_pi),
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_1f8._M_string_length);
                }
              }
              if (local_148.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_148.
                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            XmlNode::firstChild((XmlNode *)&local_1b0);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_dataplus._M_p ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              Issue::IssueImpl::create();
              pIVar19 = *(IssueImpl **)(local_168._M_dataplus._M_p + 8);
              NamedEntity::name_abi_cxx11_
                        (&local_1d0,
                         (NamedEntity *)
                         (local_190->
                         super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
              plVar11 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_1d0,0,(char *)0x0,0x2a64db);
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
                local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base
                ;
                local_218.field_2._8_8_ = plVar11[3];
              }
              else {
                local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base
                ;
                local_218._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_218._M_string_length = plVar11[1];
              *plVar11 = (long)p_Var18;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
              paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 == paVar16) {
                local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_1f8.field_2._8_8_ = plVar11[3];
                local_1f8._M_dataplus._M_p = (pointer)paVar15;
              }
              else {
                local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                local_1f8._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_1f8._M_string_length = plVar11[1];
              *plVar11 = (long)paVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              Issue::IssueImpl::setDescription(pIVar19,&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != paVar15) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != paVar13) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
              AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                        ((AnyCellmlElementImpl *)
                         **(undefined8 **)(*(long *)(local_168._M_dataplus._M_p + 8) + 0x28),
                         local_190);
              Issue::IssueImpl::setReferenceRule
                        (*(IssueImpl **)(local_168._M_dataplus._M_p + 8),ENCAPSULATION_CHILD);
              Issue::IssueImpl::setLevel(*(IssueImpl **)(local_168._M_dataplus._M_p + 8),WARNING);
              Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,(IssuePtr *)&local_168);
              _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_1b0._M_string_length;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_168._M_string_length);
                _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_1b0._M_string_length;
              }
            }
            else {
              std::
              vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
              ::push_back((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                           *)local_c8,(value_type *)&local_108);
              _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_1b0._M_string_length;
            }
            goto LAB_0022bcad;
          }
          bVar6 = XmlNode::isCellml20Element((XmlNode *)local_108._M_dataplus._M_p,"connection");
          this_01 = (vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                     *)local_128;
          if (bVar6) {
LAB_0022c18d:
            std::
            vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
            ::push_back(this_01,(value_type *)&local_108);
          }
          else {
            bVar6 = XmlNode::isText((XmlNode *)local_108._M_dataplus._M_p);
            if (bVar6) {
              XmlNode::convertToString_abi_cxx11_(&local_1f8,(XmlNode *)local_108._M_dataplus._M_p);
              bVar6 = hasNonWhitespaceCharacters(&local_1f8);
              if (bVar6) {
                Issue::IssueImpl::create();
                pIVar19 = *(IssueImpl **)
                           ((long)local_148.
                                  super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 8);
                NamedEntity::name_abi_cxx11_
                          (&local_188,
                           (NamedEntity *)
                           (local_190->
                           super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ;
                plVar11 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_188,0,(char *)0x0,0x2a6479);
                local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                psVar12 = (size_type *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar12) {
                  local_168.field_2._M_allocated_capacity = *psVar12;
                  local_168.field_2._8_8_ = plVar11[3];
                }
                else {
                  local_168.field_2._M_allocated_capacity = *psVar12;
                  local_168._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_168._M_string_length = plVar11[1];
                *plVar11 = (long)psVar12;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_168);
                local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
                  local_1b0.field_2._M_allocated_capacity =
                       (size_type)p_Var18->_vptr__Sp_counted_base;
                  local_1b0.field_2._8_8_ = plVar11[3];
                }
                else {
                  local_1b0.field_2._M_allocated_capacity =
                       (size_type)p_Var18->_vptr__Sp_counted_base;
                  local_1b0._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_1b0._M_string_length = plVar11[1];
                *plVar11 = (long)p_Var18;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                plVar11 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_1b0,(ulong)local_1f8._M_dataplus._M_p);
                paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 == paVar16) {
                  local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                  local_1d0.field_2._8_8_ = plVar11[3];
                  local_1d0._M_dataplus._M_p = (pointer)paVar13;
                }
                else {
                  local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                  local_1d0._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_1d0._M_string_length = plVar11[1];
                *plVar11 = (long)paVar16;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_1d0);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
                  local_218.field_2._M_allocated_capacity =
                       (size_type)p_Var18->_vptr__Sp_counted_base;
                  local_218.field_2._8_8_ = plVar11[3];
                }
                else {
                  local_218.field_2._M_allocated_capacity =
                       (size_type)p_Var18->_vptr__Sp_counted_base;
                  local_218._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_218._M_string_length = plVar11[1];
                *plVar11 = (long)p_Var18;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                Issue::IssueImpl::setDescription(pIVar19,&local_218);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d0._M_dataplus._M_p != paVar13) {
                  operator_delete(local_1d0._M_dataplus._M_p,
                                  local_1d0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                  operator_delete(local_1b0._M_dataplus._M_p,
                                  local_1b0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != &local_168.field_2) {
                  operator_delete(local_168._M_dataplus._M_p,
                                  local_168.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  operator_delete(local_188._M_dataplus._M_p,
                                  local_188.field_2._M_allocated_capacity + 1);
                }
                AnyCellmlElement::AnyCellmlElementImpl::setModel
                          ((AnyCellmlElementImpl *)
                           **(undefined8 **)
                             (*(size_type *)
                               ((long)local_148.
                                      super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 8) + 0x28),local_190,MODEL);
                Issue::IssueImpl::setReferenceRule
                          (*(IssueImpl **)
                            ((long)local_148.
                                   super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr + 8),XML_UNEXPECTED_CHARACTER);
                Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,&local_148);
                if (local_148.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_148.
                             super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != paVar15) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              bVar8 = local_1d8->mParsing1XVersion;
              if ((bool)bVar8 == true) {
                bVar6 = XmlNode::isCellml1XElement((XmlNode *)local_108._M_dataplus._M_p,"group");
                if (bVar6) {
                  bVar6 = isEncapsulationRelationship((XmlNodePtr *)&local_108);
                  this_01 = (vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                             *)local_c8;
                  if (bVar6) goto LAB_0022c18d;
                  goto LAB_0022bcb7;
                }
                bVar8 = local_1d8->mParsing1XVersion;
              }
              if ((bVar8 & 1) != 0) {
                bVar6 = XmlNode::isCellml1XElement
                                  ((XmlNode *)local_108._M_dataplus._M_p,"connection");
                this_01 = (vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
                           *)local_128;
                if (bVar6) goto LAB_0022c18d;
              }
              bVar6 = XmlNode::isComment((XmlNode *)local_108._M_dataplus._M_p);
              if (!bVar6) {
                Issue::IssueImpl::create();
                local_a0 = *(IssueImpl **)
                            ((long)local_148.
                                   super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr + 8);
                if (local_1d8->mParsing1XVersion == true) {
                  NamedEntity::name_abi_cxx11_
                            (&local_168,
                             (NamedEntity *)
                             (local_190->
                             super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
                  std::operator+(&local_1b0,"Model \'",&local_168);
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1b0);
                  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11 == paVar16) {
                    local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_1d0.field_2._8_8_ = plVar11[3];
                    local_1d0._M_dataplus._M_p = (pointer)paVar13;
                  }
                  else {
                    local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_1d0._M_dataplus._M_p = (pointer)*plVar11;
                  }
                  local_1d0._M_string_length = plVar11[1];
                  *plVar11 = (long)paVar16;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  XmlNode::name_abi_cxx11_(&local_188,(XmlNode *)local_108._M_dataplus._M_p);
                  std::operator+(&local_218,&local_1d0,&local_188);
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
                  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11 == paVar16) {
                    local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_1f8.field_2._8_8_ = plVar11[3];
                    local_1f8._M_dataplus._M_p = (pointer)paVar15;
                  }
                  else {
                    local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_1f8._M_dataplus._M_p = (pointer)*plVar11;
                  }
                  local_1f8._M_string_length = plVar11[1];
                  *plVar11 = (long)paVar16;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  Issue::IssueImpl::setDescription(local_a0,&local_1f8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != paVar15) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p != &local_218.field_2) {
                    operator_delete(local_218._M_dataplus._M_p,
                                    local_218.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                    operator_delete(local_188._M_dataplus._M_p,
                                    local_188.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d0._M_dataplus._M_p != paVar13) {
                    operator_delete(local_1d0._M_dataplus._M_p,
                                    local_1d0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                    operator_delete(local_1b0._M_dataplus._M_p,
                                    local_1b0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                    operator_delete(local_168._M_dataplus._M_p,
                                    local_168.field_2._M_allocated_capacity + 1);
                  }
                  Issue::IssueImpl::setLevel
                            (*(IssueImpl **)
                              ((long)local_148.
                                     super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 8),MESSAGE);
                }
                else {
                  NamedEntity::name_abi_cxx11_
                            (&local_168,
                             (NamedEntity *)
                             (local_190->
                             super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
                  std::operator+(&local_1b0,"Model \'",&local_168);
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1b0);
                  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11 == paVar16) {
                    local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_1d0.field_2._8_8_ = plVar11[3];
                    local_1d0._M_dataplus._M_p = (pointer)paVar13;
                  }
                  else {
                    local_1d0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_1d0._M_dataplus._M_p = (pointer)*plVar11;
                  }
                  local_1d0._M_string_length = plVar11[1];
                  *plVar11 = (long)paVar16;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  XmlNode::name_abi_cxx11_(&local_188,(XmlNode *)local_108._M_dataplus._M_p);
                  std::operator+(&local_218,&local_1d0,&local_188);
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
                  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(plVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11 == paVar16) {
                    local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_1f8.field_2._8_8_ = plVar11[3];
                    local_1f8._M_dataplus._M_p = (pointer)paVar15;
                  }
                  else {
                    local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
                    local_1f8._M_dataplus._M_p = (pointer)*plVar11;
                  }
                  local_1f8._M_string_length = plVar11[1];
                  *plVar11 = (long)paVar16;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  Issue::IssueImpl::setDescription(local_a0,&local_1f8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p != paVar15) {
                    operator_delete(local_1f8._M_dataplus._M_p,
                                    local_1f8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p != &local_218.field_2) {
                    operator_delete(local_218._M_dataplus._M_p,
                                    local_218.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188._M_dataplus._M_p != &local_188.field_2) {
                    operator_delete(local_188._M_dataplus._M_p,
                                    local_188.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d0._M_dataplus._M_p != paVar13) {
                    operator_delete(local_1d0._M_dataplus._M_p,
                                    local_1d0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                    operator_delete(local_1b0._M_dataplus._M_p,
                                    local_1b0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                    operator_delete(local_168._M_dataplus._M_p,
                                    local_168.field_2._M_allocated_capacity + 1);
                  }
                  Issue::IssueImpl::setReferenceRule
                            (*(IssueImpl **)
                              ((long)local_148.
                                     super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 8),XML_UNEXPECTED_ELEMENT);
                }
                AnyCellmlElement::AnyCellmlElementImpl::setModel
                          ((AnyCellmlElementImpl *)
                           **(undefined8 **)
                             (*(size_type *)
                               ((long)local_148.
                                      super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 8) + 0x28),local_190,MODEL);
                Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,&local_148);
                _Var21._M_pi = local_148.
                               super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi;
                goto LAB_0022bcad;
              }
            }
          }
        }
        else {
          Component::create();
          loadComponent(local_1d8,(ComponentPtr *)&local_1f8,(XmlNodePtr *)&local_108);
          ComponentEntity::addComponent
                    (&((local_190->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)
                      ._M_ptr)->super_ComponentEntity,(ComponentPtr *)&local_1f8);
          _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length;
          if (local_1d8->mParsing1XVersion == true) {
            loadUnitsFromComponent(local_1d8,local_190,(XmlNodePtr *)&local_108);
            _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_1f8._M_string_length;
          }
LAB_0022bcad:
          if (_Var21._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var21._M_pi);
          }
        }
LAB_0022bcb7:
        XmlNode::next((XmlNode *)&local_1f8);
        sVar1 = local_108._M_string_length;
        local_108._M_string_length = local_1f8._M_string_length;
        local_108._M_dataplus._M_p = local_1f8._M_dataplus._M_p;
        local_1f8._M_dataplus._M_p = (pointer)0x0;
        local_1f8._M_string_length = 0;
        if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1 !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1),
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length !=
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._M_string_length);
        }
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_108._M_dataplus._M_p !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0);
      if ((local_c8._0_8_ != local_c8._8_8_) &&
         (loadEncapsulation(local_1d8,local_190,(XmlNodePtr *)local_c8._0_8_),
         0x10 < (ulong)(local_c8._8_8_ - local_c8._0_8_))) {
        Issue::IssueImpl::create();
        pIVar19 = *(IssueImpl **)(local_1b0._M_dataplus._M_p + 8);
        NamedEntity::name_abi_cxx11_
                  (&local_1d0,
                   (NamedEntity *)
                   (local_190->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x2a6479);
        p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar11 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar11 == p_Var18) {
          local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
          local_218.field_2._8_8_ = plVar11[3];
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        }
        else {
          local_218.field_2._M_allocated_capacity = (size_type)p_Var18->_vptr__Sp_counted_base;
          local_218._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_218._M_string_length = plVar11[1];
        *plVar11 = (long)p_Var18;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar16) {
          local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_1f8.field_2._8_8_ = plVar11[3];
          local_1f8._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_1f8._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_1f8._M_string_length = plVar11[1];
        *plVar11 = (long)paVar16;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        Issue::IssueImpl::setDescription(pIVar19,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != paVar15) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != paVar13) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                  ((AnyCellmlElementImpl *)
                   **(undefined8 **)(*(long *)(local_1b0._M_dataplus._M_p + 8) + 0x28),local_190);
        Issue::IssueImpl::setReferenceRule
                  (*(IssueImpl **)(local_1b0._M_dataplus._M_p + 8),MODEL_MORE_THAN_ONE_ENCAPSULATION
                  );
        Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,(IssuePtr *)&local_1b0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b0._M_string_length);
        }
      }
    }
    uVar20 = local_128._8_8_;
    local_1f8._M_dataplus._M_p = (pointer)0x0;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_allocated_capacity = 0;
    if (local_128._0_8_ != local_128._8_8_) {
      p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._0_8_;
      do {
        loadConnection(local_1d8,local_190,(XmlNodePtr *)p_Var18,(NamePairList *)&local_1f8);
        p_Var18 = p_Var18 + 1;
      } while (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar20);
    }
    local_218._M_dataplus._M_p = (pointer)0x0;
    local_218._M_string_length = 0;
    local_218.field_2._M_allocated_capacity = 0;
    local_1d0._M_dataplus._M_p =
         (pointer)(local_190->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
    local_1d0._M_string_length =
         (size_type)
         (local_190->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length)->
             _M_use_count + 1;
      }
    }
    traverseComponentEntityTreeLinkingUnits
              ((ComponentEntityPtr *)&local_1d0,(DescriptionList *)&local_218);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length);
    }
    sVar1 = local_218._M_string_length;
    if (local_218._M_dataplus._M_p != (pointer)local_218._M_string_length) {
      _Var22._M_p = local_218._M_dataplus._M_p;
      do {
        Issue::IssueImpl::create();
        Issue::IssueImpl::setDescription
                  (*(IssueImpl **)(local_1d0._M_dataplus._M_p + 8),
                   (string *)((long)_Var22._M_p + 0x10));
        Issue::IssueImpl::setLevel(*(IssueImpl **)(local_1d0._M_dataplus._M_p + 8),WARNING);
        Issue::IssueImpl::setReferenceRule
                  (*(IssueImpl **)(local_1d0._M_dataplus._M_p + 8),VARIABLE_ELEMENT);
        AnyCellmlElement::AnyCellmlElementImpl::setVariable
                  ((AnyCellmlElementImpl *)
                   **(undefined8 **)(*(size_type *)(local_1d0._M_dataplus._M_p + 8) + 0x28),
                   (VariablePtr *)_Var22._M_p);
        Logger::LoggerImpl::addIssue(&local_1d8->super_LoggerImpl,(IssuePtr *)&local_1d0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length);
        }
        _Var22._M_p = _Var22._M_p + 0x30;
      } while (_Var22._M_p != (pointer)sVar1);
    }
    std::
    vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_218);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1f8);
    std::
    vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
               *)local_c8);
    std::
    vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::XmlNode>,_std::allocator<std::shared_ptr<libcellml::XmlNode>_>_>
               *)local_128);
    _Var21._M_pi = local_e8.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length);
      _Var21._M_pi = local_e8.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
  }
  if (_Var21._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var21._M_pi);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_88);
LAB_0022d1e5:
  if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
  }
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  return;
}

Assistant:

void Parser::ParserImpl::loadModel(const ModelPtr &model, const std::string &input)
{
    XmlDocPtr doc = std::make_shared<XmlDoc>();
    doc->parse(input);
    // Copy any XML parsing issues into the common parser issue handler.
    if (doc->xmlErrorCount() > 0) {
        for (size_t i = 0; i < doc->xmlErrorCount(); ++i) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("LibXml2 error: " + doc->xmlError(i));
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML);
            addIssue(issue);
        }
    }
    const XmlNodePtr node = doc->rootNode();
    if (!node) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Could not get a valid XML root node from the provided input.");
        if (mParser->isStrict()) {
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML);
        }
        addIssue(issue);
        return;
    }

    mParsing20Version = node->isCellml20Element("model");

    auto elementNamespaceMap = traverseTreeForElementNamespaces(node);
    if (mParsing20Version) {
        for (const auto &e : elementNamespaceMap) {
            std::string name = e.first;
            std::string uri = e.second;
            if ((uri != CELLML_2_0_NS) && (uri != MATHML_NS)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Element '" + name + "' uses namespace '" + uri + "' which does not belong to an allowed namespace. ");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_NAMESPACE);
                addIssue(issue);
            }
        }
    }

    auto attributeNamespaceMap = traverseTreeForAttributeNamespaces(node);
    if (mParsing20Version) {
        for (const auto &e : attributeNamespaceMap) {
            std::string nodeName = std::get<0>(e);
            std::string nodeUri = std::get<4>(e);
            std::string attributeName = std::get<1>(e);
            std::string uri = std::get<3>(e);
            if ((nodeName == "cn") && (nodeUri == MATHML_NS) && (attributeName == "units") && (uri == CELLML_2_0_NS)) {
                // Explicitly allowed attribute namespace prefix.
            } else if ((nodeName == "import") && (nodeUri == CELLML_2_0_NS) && (attributeName == "href") && (uri == XLINK_NS)) {
                // Explicitly allowed attribute namespace prefix.
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Element '" + nodeName + "' attribute '" + attributeName + "' has a namespace '" + uri + "' specified.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ATTRIBUTE_HAS_NAMESPACE);
                addIssue(issue);
            }
        }
    }

    if ((mParser->isStrict() && !mParsing20Version) || !node->isCellmlElement("model")) {
        auto issue = Issue::IssueImpl::create();
        if (node->name() == "model") {
            std::string nodeNamespace = node->namespaceUri();
            if (nodeNamespace.empty()) {
                nodeNamespace = "null";
            }
            if (mParser->isStrict() && node->isCellml1XElement("model")) {
                issue->mPimpl->setDescription("Given model is a CellML " + nodesCellMl1XVersion(node) + " model but strict parsing mode is on.");
            } else {
                std::string message = "Model element is in an invalid namespace '" + nodeNamespace + "'.";
                if (mParser->isStrict()) {
                    message += " A valid CellML root node should be in the namespace '" + std::string(CELLML_2_0_NS) + "'.";
                }
                issue->mPimpl->setDescription(message);
            }
        } else {
            issue->mPimpl->setDescription("Model element is of invalid type '" + node->name() + "'. A valid CellML root node should be of type 'model'.");
        }
        issue->mPimpl->mItem->mPimpl->setModel(model);
        if (mParser->isStrict()) {
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
        }
        addIssue(issue);
        return;
    }
    mParsing1XVersion = node->isCellml1XElement("model");
    if (mParsing1XVersion) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Given model is a CellML " + nodesCellMl1XVersion(node) + " model, the parser will try to represent this model in CellML 2.0.");
        issue->mPimpl->setLevel(Issue::Level::MESSAGE);
        issue->mPimpl->mItem->mPimpl->setModel(model);
        addIssue(issue);
    }
    // Get model attributes.
    bool nameAttributePresent = false;
    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("name")) {
            model->setName(attribute->value());
            nameAttributePresent = true;
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            model->setId(attribute->value());
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Model '" + node->attribute("name") + "' ignoring attribute '" + attribute->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Model '" + node->attribute("name") + "' has an invalid attribute '" + attribute->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::MODEL_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setModel(model);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!mParsing1XVersion && !nameAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Model does not have a name attribute.");
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::MODEL_NAME);
        issue->mPimpl->mItem->mPimpl->setModel(model);
        addIssue(issue);
    }

    // Get model children (CellML entities).
    XmlNodePtr childNode = node->firstChild();
    std::vector<XmlNodePtr> connectionNodes;
    std::vector<XmlNodePtr> encapsulationNodes;
    while (childNode != nullptr) {
        if (parseNode(childNode, "component")) {
            auto component = Component::create();
            loadComponent(component, childNode);
            model->addComponent(component);
            if (mParsing1XVersion) {
                loadUnitsFromComponent(model, childNode);
            }
        } else if (parseNode(childNode, "units")) {
            UnitsPtr units = Units::create();
            loadUnits(units, childNode);
            model->addUnits(units);
        } else if (parseNode(childNode, "import")) {
            ImportSourcePtr importSource = ImportSource::create();
            loadImport(importSource, model, childNode);
        } else if (childNode->isCellml20Element("encapsulation")) {
            // An encapsulation should not have attributes other than an 'id' attribute.
            if (childNode->firstAttribute()) {
                XmlAttributePtr childAttribute = childNode->firstAttribute();
                while (childAttribute) {
                    if (isIdAttribute(childAttribute, false)) {
                        model->setEncapsulationId(childAttribute->value());
                    } else {
                        auto issue = Issue::IssueImpl::create();
                        issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid attribute '" + childAttribute->name() + "'.");
                        issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_ELEMENT);
                        addIssue(issue);
                    }
                    childAttribute = childAttribute->next();
                }
            }
            // Load encapsulated component_refs.
            XmlNodePtr componentRefNode = childNode->firstChild();
            if (componentRefNode != nullptr) {
                // This component_ref and its child and sibling elements will be loaded
                // and issue-checked in loadEncapsulation().
                encapsulationNodes.push_back(childNode);
            } else {
                // Empty encapsulations are valid, but may not be intended.
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' does not contain any child elements.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::ENCAPSULATION_CHILD);
                issue->mPimpl->setLevel(libcellml::Issue::Level::WARNING);
                addIssue(issue);
            }
        } else if (childNode->isCellml20Element("connection")) {
            connectionNodes.push_back(childNode);
        } else if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Model '" + model->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setModel(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (mParsing1XVersion && childNode->isCellml1XElement("group")) {
            if (isEncapsulationRelationship(childNode)) {
                encapsulationNodes.push_back(childNode);
            }
        } else if (mParsing1XVersion && childNode->isCellml1XElement("connection")) {
            connectionNodes.push_back(childNode);
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Model '" + model->name() + "' ignoring child element '" + childNode->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Model '" + model->name() + "' has an invalid child element '" + childNode->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setModel(model);
            addIssue(issue);
        }
        childNode = childNode->next();
    }

    if (!encapsulationNodes.empty()) {
        loadEncapsulation(model, encapsulationNodes.at(0));
        if (encapsulationNodes.size() > 1) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Model '" + model->name() + "' has more than one encapsulation element.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::MODEL_MORE_THAN_ONE_ENCAPSULATION);
            addIssue(issue);
        }
    }

    NamePairList usedConnections;
    for (const auto &connectionNode : connectionNodes) {
        loadConnection(model, connectionNode, usedConnections);
    }

    // Link units to their names.
    DescriptionList issueList;
    traverseComponentEntityTreeLinkingUnits(model, issueList);
    for (const auto &entry : issueList) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription(entry.second);
        issue->mPimpl->setLevel(Issue::Level::WARNING);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_ELEMENT);
        issue->mPimpl->mItem->mPimpl->setVariable(entry.first);
        addIssue(issue);
    }
}